

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo_KEM.h
# Opt level: O3

void Hacl_Impl_Frodo_Params_frodo_gen_matrix
               (Spec_Frodo_Params_frodo_gen_a a,uint32_t n,uint8_t *seed,uint16_t *a_matrix)

{
  short sVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  uint8_t *tmp_seed0;
  uint8_t *r3;
  undefined4 in_register_00000034;
  undefined7 in_register_00000039;
  undefined8 *puVar5;
  long lVar6;
  uint8_t *tmp_seed2;
  uint8_t *tmp_seed3;
  uint8_t r [813040];
  short local_1f08;
  undefined8 local_1f06;
  undefined8 uStack_1efe;
  short local_1ef6;
  undefined8 local_1ef4;
  undefined8 uStack_1eec;
  short local_1ee4;
  undefined8 local_1ee2;
  undefined8 uStack_1eda;
  short local_1ed2;
  undefined8 local_1ed0;
  undefined8 uStack_1ec8;
  uint8_t local_1eb8 [8];
  undefined8 auStack_1eb0 [243];
  uint8_t local_1718 [8];
  undefined8 auStack_1710 [243];
  uint8_t local_f78 [8];
  undefined8 auStack_f70 [243];
  uint8_t local_7d8 [8];
  undefined8 auStack_7d0 [244];
  
  puVar5 = (undefined8 *)CONCAT71(in_register_00000039,a);
  lVar6 = 0;
  memset(local_1eb8,0,0x1e80);
  local_1f06 = *puVar5;
  uStack_1efe = puVar5[1];
  local_1ef4 = *puVar5;
  uStack_1eec = puVar5[1];
  local_1ee2 = *puVar5;
  uStack_1eda = puVar5[1];
  local_1ed0 = *puVar5;
  uStack_1ec8 = puVar5[1];
  memset((void *)CONCAT44(in_register_00000034,n),0,0x1d1200);
  lVar4 = (long)CONCAT44(in_register_00000034,n) + 0x16e0;
  do {
    sVar1 = (short)lVar6;
    local_1f08 = sVar1 * 4;
    local_1ef6 = sVar1 * 4 + 1;
    local_1ee4 = sVar1 * 4 + 2;
    local_1ed2 = sVar1 * 4 + 3;
    Hacl_Hash_SHA3_shake128(local_1eb8,0x7a0,(uint8_t *)&local_1f08,0x12);
    Hacl_Hash_SHA3_shake128(local_1718,0x7a0,(uint8_t *)&local_1ef6,0x12);
    Hacl_Hash_SHA3_shake128(local_f78,0x7a0,(uint8_t *)&local_1ee4,0x12);
    Hacl_Hash_SHA3_shake128(local_7d8,0x7a0,(uint8_t *)&local_1ed2,0x12);
    lVar3 = 0;
    do {
      uVar2 = *(undefined8 *)((long)auStack_1eb0 + lVar3 * 2);
      puVar5 = (undefined8 *)(lVar4 + -0x16e0 + lVar3 * 2);
      *puVar5 = *(undefined8 *)((long)auStack_1eb0 + lVar3 * 2 + -8);
      puVar5[1] = uVar2;
      uVar2 = *(undefined8 *)((long)auStack_1710 + lVar3 * 2);
      puVar5 = (undefined8 *)(lVar4 + -0xf40 + lVar3 * 2);
      *puVar5 = *(undefined8 *)((long)auStack_1710 + lVar3 * 2 + -8);
      puVar5[1] = uVar2;
      uVar2 = *(undefined8 *)((long)auStack_f70 + lVar3 * 2);
      puVar5 = (undefined8 *)(lVar4 + -0x7a0 + lVar3 * 2);
      *puVar5 = *(undefined8 *)((long)auStack_f70 + lVar3 * 2 + -8);
      puVar5[1] = uVar2;
      uVar2 = *(undefined8 *)((long)auStack_7d0 + lVar3 * 2);
      puVar5 = (undefined8 *)(lVar4 + lVar3 * 2);
      *puVar5 = *(undefined8 *)((long)auStack_7d0 + lVar3 * 2 + -8);
      puVar5[1] = uVar2;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x3d0);
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 0x1e80;
  } while (lVar6 != 0xf4);
  return;
}

Assistant:

static inline void
Hacl_Impl_Frodo_Params_frodo_gen_matrix(
  Spec_Frodo_Params_frodo_gen_a a,
  uint32_t n,
  uint8_t *seed,
  uint16_t *a_matrix
)
{
  switch (a)
  {
    case Spec_Frodo_Params_SHAKE128:
      {
        Hacl_Impl_Frodo_Gen_frodo_gen_matrix_shake_4x(n, seed, a_matrix);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}